

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.h
# Opt level: O0

void __thiscall ctemplate::TemplateDictionary::SetProxy::operator=(SetProxy *this,str_ref value)

{
  TemplateString *pTVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  char *s;
  size_t slen;
  TemplateString local_60;
  char *local_40;
  size_t local_38;
  undefined8 local_30;
  TemplateId local_28;
  SetProxy *local_20;
  SetProxy *this_local;
  str_ref value_local;
  
  value_local.begin_ = value.end_;
  this_local = (SetProxy *)value.begin_;
  pTVar1 = this->variable_;
  local_40 = pTVar1->ptr_;
  local_38 = pTVar1->length_;
  local_30 = *(undefined8 *)&pTVar1->is_immutable_;
  local_28 = pTVar1->id_;
  local_20 = this;
  s = str_ref_basic<const_char_*>::data((str_ref_basic<const_char_*> *)&this_local);
  slen = str_ref_basic<const_char_*>::size((str_ref_basic<const_char_*> *)&this_local);
  TemplateString::TemplateString(&local_60,s,slen);
  TVar2.length_ = local_38;
  TVar2.ptr_ = local_40;
  TVar2._16_8_ = local_30;
  TVar2.id_ = local_28;
  TVar3.length_ = local_60.length_;
  TVar3.ptr_ = local_60.ptr_;
  TVar3.is_immutable_ = local_60.is_immutable_;
  TVar3._17_7_ = local_60._17_7_;
  TVar3.id_ = local_60.id_;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar3);
  return;
}

Assistant:

void operator=(str_ref value) {
      dict_.SetValue(variable_, TemplateString(value.data(), value.size()));
    }